

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_default_str_add_fail2(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  char *s1;
  cargo_t local_20;
  char *local_18;
  
  iVar1 = cargo_init(&local_20,0,"program");
  if (iVar1 == 0) {
    local_18 = "abc";
    pcVar2 = (char *)0x0;
    iVar1 = cargo_add_option(local_20,CARGO_OPT_DEFAULT_LITERAL,"--alpha -a","an option","s");
    if (iVar1 == 0) {
      pcVar2 = "Expected to fail";
    }
    cargo_destroy(&local_20);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_default_str_add_fail2)
{
    char *s1 = "abc";
    cargo_assert(s1, "Failed to allocate");

    // This should fail sinc CARGO_AUTOCLEAN is not on.
    ret = cargo_add_option(cargo, CARGO_OPT_DEFAULT_LITERAL,
            "--alpha -a", "an option", "s", &s1);
    cargo_assert(ret != 0, "Expected to fail");

    _TEST_CLEANUP();
}